

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

void ucase_addCaseClosure_63(UChar32 c,USetAdder *sa)

{
  ushort uVar1;
  UChar UVar2;
  uint uVar3;
  undefined2 *puVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  int local_84;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  uint local_50;
  int32_t delta_1;
  int32_t length;
  int32_t fullLength;
  int32_t closureLength;
  int32_t idx;
  uint16_t excWord;
  UChar *closure;
  uint16_t *pe;
  uint16_t *pe0;
  int32_t delta;
  uint16_t props;
  USetAdder *sa_local;
  UChar32 c_local;
  
  if (c == 0x49) {
    (*(code *)sa->add)(sa->set,0x69);
  }
  else if (c == 0x69) {
    (*(code *)sa->add)(sa->set,0x49);
  }
  else if (c == 0x130) {
    (*sa->addString)(sa->set,L"i̇",2);
  }
  else if (c != 0x131) {
    uVar3 = c >> 5;
    if ((uint)c < 0xd800) {
      local_64 = (uint)ucase_props_trieIndex[(int)uVar3] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x10000) {
        iVar6 = 0;
        if (c < 0xdc00) {
          iVar6 = 0x140;
        }
        local_68 = (uint)ucase_props_trieIndex[(int)(iVar6 + uVar3)] * 4 + (c & 0x1fU);
      }
      else {
        if ((uint)c < 0x110000) {
          if (c < 0xe0800) {
            local_70 = (uint)ucase_props_trieIndex
                             [(int)((uint)ucase_props_trieIndex[(c >> 0xb) + 0x820] + (uVar3 & 0x3f)
                                   )] * 4 + (c & 0x1fU);
          }
          else {
            local_70 = 0x2f1c;
          }
          local_6c = local_70;
        }
        else {
          local_6c = 0xd30;
        }
        local_68 = local_6c;
      }
      local_64 = local_68;
    }
    uVar1 = ucase_props_trieIndex[local_64];
    if ((uVar1 & 8) == 0) {
      if (((uVar1 & 3) != 0) && ((int)(short)uVar1 >> 7 != 0)) {
        (*(code *)sa->add)(sa->set,c + ((int)(short)uVar1 >> 7));
      }
    }
    else {
      lVar7 = (long)((int)(uint)uVar1 >> 4) * 2 + 0x255bb2;
      uVar1 = ucase_props_exceptions[(int)(uint)uVar1 >> 4];
      sa_local._4_4_ = c;
      for (fullLength = 0; fullLength < 4; fullLength = fullLength + 1) {
        bVar5 = (byte)fullLength;
        if (((uint)uVar1 & 1 << (bVar5 & 0x1f)) != 0) {
          if ((uVar1 & 0x100) == 0) {
            sa_local._4_4_ =
                 (uint)*(ushort *)
                        (lVar7 + (long)(int)(uint)""[(int)((uint)uVar1 & (1 << (bVar5 & 0x1f)) - 1U)
                                                    ] * 2);
          }
          else {
            puVar4 = (undefined2 *)
                     (lVar7 + (long)(int)((uint)""[(int)((uint)uVar1 & (1 << (bVar5 & 0x1f)) - 1U)]
                                         << 1) * 2);
            sa_local._4_4_ = CONCAT22(*puVar4,puVar4[1]);
          }
          (*(code *)sa->add)(sa->set,sa_local._4_4_);
        }
      }
      if ((uVar1 & 0x10) != 0) {
        if ((uVar1 & 0x100) == 0) {
          local_50 = (uint)*(ushort *)(lVar7 + (long)(int)(uint)""[(int)(uVar1 & 0xf)] * 2);
        }
        else {
          puVar4 = (undefined2 *)(lVar7 + (long)(int)((uint)""[(int)(uVar1 & 0xf)] << 1) * 2);
          local_50 = CONCAT22(*puVar4,puVar4[1]);
        }
        if ((uVar1 & 0x400) != 0) {
          local_50 = -local_50;
        }
        local_84 = sa_local._4_4_ + local_50;
        (*(code *)sa->add)(sa->set,local_84);
      }
      if ((uVar1 & 0x40) == 0) {
        length = 0;
        _idx = (UChar *)0x0;
      }
      else {
        if ((uVar1 & 0x100) == 0) {
          closure = (UChar *)(lVar7 + (long)(int)(uint)""[(int)(uVar1 & 0x3f)] * 2);
          UVar2 = *closure;
        }
        else {
          closure = (UChar *)(lVar7 + (long)(int)((uint)""[(int)(uVar1 & 0x3f)] << 1) * 2 + 2);
          UVar2 = *closure;
        }
        length = (int32_t)(ushort)UVar2;
        length = length & 0xf;
        _idx = closure + 1;
      }
      if ((uVar1 & 0x80) != 0) {
        if ((uVar1 & 0x100) == 0) {
          closure = (UChar *)(lVar7 + (long)(int)(uint)""[(int)(uVar1 & 0x7f)] * 2);
          UVar2 = *closure;
        }
        else {
          closure = (UChar *)(lVar7 + (long)(int)((uint)""[(int)(uVar1 & 0x7f)] << 1) * 2 + 2);
          UVar2 = *closure;
        }
        delta_1 = (int32_t)(ushort)UVar2;
        closure = closure + (long)(int)(delta_1 & 0xf) + 1;
        uVar3 = delta_1 >> 4 & 0xf;
        if (uVar3 != 0) {
          (*sa->addString)(sa->set,closure,uVar3);
          closure = closure + (int)uVar3;
        }
        _idx = closure + (long)(int)(delta_1 >> 8 & 0xf) + (long)(delta_1 >> 0xc);
      }
      fullLength = 0;
      while (fullLength < length) {
        sa_local._4_4_ = (uint)(ushort)_idx[fullLength];
        iVar6 = fullLength + 1;
        if ((sa_local._4_4_ & 0xfffffc00) == 0xd800) {
          sa_local._4_4_ = sa_local._4_4_ * 0x400 + (uint)(ushort)_idx[fullLength + 1] + 0xfca02400;
          iVar6 = fullLength + 2;
        }
        fullLength = iVar6;
        (*(code *)sa->add)(sa->set,sa_local._4_4_);
      }
    }
  }
  return;
}

Assistant:

U_CFUNC void U_EXPORT2
ucase_addCaseClosure(UChar32 c, const USetAdder *sa) {
    uint16_t props;

    /*
     * Hardcode the case closure of i and its relatives and ignore the
     * data file data for these characters.
     * The Turkic dotless i and dotted I with their case mapping conditions
     * and case folding option make the related characters behave specially.
     * This code matches their closure behavior to their case folding behavior.
     */

    switch(c) {
    case 0x49:
        /* regular i and I are in one equivalence class */
        sa->add(sa->set, 0x69);
        return;
    case 0x69:
        sa->add(sa->set, 0x49);
        return;
    case 0x130:
        /* dotted I is in a class with <0069 0307> (for canonical equivalence with <0049 0307>) */
        sa->addString(sa->set, iDot, 2);
        return;
    case 0x131:
        /* dotless i is in a class by itself */
        return;
    default:
        /* otherwise use the data file data */
        break;
    }

    props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_GET_TYPE(props)!=UCASE_NONE) {
            /* add the one simple case mapping, no matter what type it is */
            int32_t delta=UCASE_GET_DELTA(props);
            if(delta!=0) {
                sa->add(sa->set, c+delta);
            }
        }
    } else {
        /*
         * c has exceptions, so there may be multiple simple and/or
         * full case mappings. Add them all.
         */
        const uint16_t *pe0, *pe=GET_EXCEPTIONS(&ucase_props_singleton, props);
        const UChar *closure;
        uint16_t excWord=*pe++;
        int32_t idx, closureLength, fullLength, length;

        pe0=pe;

        /* add all simple case mappings */
        for(idx=UCASE_EXC_LOWER; idx<=UCASE_EXC_TITLE; ++idx) {
            if(HAS_SLOT(excWord, idx)) {
                pe=pe0;
                GET_SLOT_VALUE(excWord, idx, pe, c);
                sa->add(sa->set, c);
            }
        }
        if(HAS_SLOT(excWord, UCASE_EXC_DELTA)) {
            pe=pe0;
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe, delta);
            sa->add(sa->set, (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta);
        }

        /* get the closure string pointer & length */
        if(HAS_SLOT(excWord, UCASE_EXC_CLOSURE)) {
            pe=pe0;
            GET_SLOT_VALUE(excWord, UCASE_EXC_CLOSURE, pe, closureLength);
            closureLength&=UCASE_CLOSURE_MAX_LENGTH; /* higher bits are reserved */
            closure=(const UChar *)pe+1; /* behind this slot, unless there are full case mappings */
        } else {
            closureLength=0;
            closure=NULL;
        }

        /* add the full case folding */
        if(HAS_SLOT(excWord, UCASE_EXC_FULL_MAPPINGS)) {
            pe=pe0;
            GET_SLOT_VALUE(excWord, UCASE_EXC_FULL_MAPPINGS, pe, fullLength);

            /* start of full case mapping strings */
            ++pe;

            fullLength&=0xffff; /* bits 16 and higher are reserved */

            /* skip the lowercase result string */
            pe+=fullLength&UCASE_FULL_LOWER;
            fullLength>>=4;

            /* add the full case folding string */
            length=fullLength&0xf;
            if(length!=0) {
                sa->addString(sa->set, (const UChar *)pe, length);
                pe+=length;
            }

            /* skip the uppercase and titlecase strings */
            fullLength>>=4;
            pe+=fullLength&0xf;
            fullLength>>=4;
            pe+=fullLength;

            closure=(const UChar *)pe; /* behind full case mappings */
        }

        /* add each code point in the closure string */
        for(idx=0; idx<closureLength;) {
            U16_NEXT_UNSAFE(closure, idx, c);
            sa->add(sa->set, c);
        }
    }
}